

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,quatd *value)

{
  value_type_conflict1 vVar1;
  bool bVar2;
  reference pvVar3;
  reference pvVar4;
  undefined1 local_40 [8];
  double4 v;
  quatd *value_local;
  AsciiParser *this_local;
  
  v._M_elems[3] = (double)value;
  bVar2 = ReadBasicType(this,(double4 *)local_40);
  if (bVar2) {
    pvVar3 = ::std::array<double,_4UL>::operator[]((array<double,_4UL> *)local_40,0);
    *(value_type_conflict1 *)((long)v._M_elems[3] + 0x18) = *pvVar3;
    pvVar3 = ::std::array<double,_4UL>::operator[]((array<double,_4UL> *)local_40,1);
    vVar1 = *pvVar3;
    pvVar4 = ::std::array<double,_3UL>::operator[]((array<double,_3UL> *)v._M_elems[3],0);
    *pvVar4 = vVar1;
    pvVar3 = ::std::array<double,_4UL>::operator[]((array<double,_4UL> *)local_40,2);
    vVar1 = *pvVar3;
    pvVar4 = ::std::array<double,_3UL>::operator[]((array<double,_3UL> *)v._M_elems[3],1);
    *pvVar4 = vVar1;
    pvVar3 = ::std::array<double,_4UL>::operator[]((array<double,_4UL> *)local_40,3);
    vVar1 = *pvVar3;
    pvVar4 = ::std::array<double,_3UL>::operator[]((array<double,_3UL> *)v._M_elems[3],2);
    *pvVar4 = vVar1;
  }
  return bVar2;
}

Assistant:

bool AsciiParser::ReadBasicType(value::quatd *value) {
  value::double4 v;
  if (ReadBasicType(&v)) {
    value->real = v[0];
    value->imag[0] = v[1];
    value->imag[1] = v[2];
    value->imag[2] = v[3];
    return true;
  }
  return false;
}